

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluent_builder.cpp
# Opt level: O0

HtmlBuilder * HtmlElement::build(HtmlBuilder *__return_storage_ptr__,string *name)

{
  string local_38;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  name_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  HtmlBuilder::HtmlBuilder(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

HtmlBuilder HtmlElement::build(std::string name)
{
	return HtmlBuilder(std::move(name));
}